

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O1

int uv_fs_utime(uv_loop_t *loop,uv_fs_t *req,char *path,double atime,double mtime,uv_fs_cb cb)

{
  long *plVar1;
  int iVar2;
  char *pcVar3;
  
  req->type = UV_FS;
  if (cb != (uv_fs_cb)0x0) {
    req->type = UV_FS;
    req->active_queue[0] = loop->active_reqs;
    plVar1 = (long *)loop->active_reqs[1];
    req->active_queue[1] = plVar1;
    *plVar1 = (long)req->active_queue;
    loop->active_reqs[1] = req->active_queue;
  }
  req->fs_type = UV_FS_UTIME;
  req->result = 0;
  req->ptr = (void *)0x0;
  req->loop = loop;
  req->path = (char *)0x0;
  req->new_path = (char *)0x0;
  req->cb = cb;
  if (path != (char *)0x0) {
    if (cb == (uv_fs_cb)0x0) {
      req->path = path;
    }
    else {
      pcVar3 = uv__strdup(path);
      req->path = pcVar3;
      if (pcVar3 == (char *)0x0) {
        if (loop->active_reqs != (void **)loop->active_reqs[0]) {
          *(void **)req->active_queue[1] = req->active_queue[0];
          *(void **)((long)req->active_queue[0] + 8) = req->active_queue[1];
          return -0xc;
        }
        pcVar3 = "uv__has_active_reqs(loop)";
        goto LAB_0053fb39;
      }
    }
    req->atime = atime;
    req->mtime = mtime;
    if (cb == (uv_fs_cb)0x0) {
      uv__fs_work(&req->work_req);
      iVar2 = (int)req->result;
    }
    else {
      uv__work_submit(loop,&req->work_req,uv__fs_work,uv__fs_done);
      iVar2 = 0;
    }
    return iVar2;
  }
  pcVar3 = "path != NULL";
LAB_0053fb39:
  __assert_fail(pcVar3,
                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/fs.c"
                ,0x52b,
                "int uv_fs_utime(uv_loop_t *, uv_fs_t *, const char *, double, double, uv_fs_cb)");
}

Assistant:

int uv_fs_utime(uv_loop_t* loop,
                uv_fs_t* req,
                const char* path,
                double atime,
                double mtime,
                uv_fs_cb cb) {
  INIT(UTIME);
  PATH;
  req->atime = atime;
  req->mtime = mtime;
  POST;
}